

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86::forward(Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  _func_int *p_Var4;
  _func_int **pp_Var5;
  long *plVar6;
  Layer *pLVar7;
  bool bVar8;
  int iVar9;
  undefined *puVar10;
  int iVar11;
  long lVar12;
  code *pcVar13;
  Convolution *this_00;
  int iVar14;
  int _h;
  int iVar15;
  Mat bottom_blob_int8;
  Option opt_g;
  Mat bottom_blob_unbordered;
  Mat top_blob_tm_g;
  vector<float,_std::allocator<float>_> local_c8 [2];
  Mat top_blob_g;
  Option opt_g_1;
  
  bottom_blob_unbordered.dims = bottom_blob->dims;
  this_00 = (Convolution *)
            ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]);
  if (bottom_blob_unbordered.dims != 3) {
LAB_00126ae9:
    iVar11 = Convolution::forward(this_00,bottom_blob,top_blob,opt);
    return iVar11;
  }
  iVar11 = this_00->kernel_w;
  if (iVar11 != this_00->kernel_h) goto LAB_00126ae9;
  iVar2 = this_00->stride_w;
  if (((iVar2 != this_00->stride_h) || (7 < iVar2 || 7 < iVar11)) ||
     (this_00->dilation_w != this_00->dilation_h)) goto LAB_00126ae9;
  if (this_00->use_int8_inference == true) {
    lVar12 = (long)iVar11 + -1;
    lVar1 = (long)iVar2 + -1;
    if (this_00->use_int8_requantize == true) {
      puVar10 = (&PTR_conv1x1s1_int8_requant_sse_0017b290)[lVar12 * 4 + lVar1];
      pcVar13 = (code *)0x0;
    }
    else {
      pcVar13 = (code *)(&PTR_conv1x1s1_int8_dequant_sse_0017b1b0)[lVar12 * 4 + lVar1];
      puVar10 = (undefined *)0x0;
    }
    if (puVar10 == (undefined *)0x0 && pcVar13 == (code *)0x0) goto LAB_00126ae9;
  }
  else {
    lVar12 = *(long *)((long)iVar11 * 0x20 + 0x17b0a8 + (long)iVar2 * 8);
    if (lVar12 == 0) goto LAB_00126ae9;
    if (this_00->dilation_w != 1) {
      if (iVar2 == 1) {
        iVar11 = (*this->_vptr_Convolution_x86[3])(this,bottom_blob,top_blob,lVar12,opt);
        return iVar11;
      }
      goto LAB_00126ae9;
    }
    pcVar13 = (code *)0x0;
  }
  iVar15 = bottom_blob->w;
  _h = bottom_blob->h;
  bottom_blob_unbordered.c = bottom_blob->c;
  sVar3 = bottom_blob->elemsize;
  bottom_blob_unbordered.data = bottom_blob->data;
  bottom_blob_unbordered.refcount = bottom_blob->refcount;
  bottom_blob_unbordered.packing = bottom_blob->packing;
  bottom_blob_unbordered.allocator = bottom_blob->allocator;
  bottom_blob_unbordered.cstep = bottom_blob->cstep;
  if (bottom_blob_unbordered.refcount != (int *)0x0) {
    LOCK();
    *bottom_blob_unbordered.refcount = *bottom_blob_unbordered.refcount + 1;
    UNLOCK();
  }
  bottom_blob_unbordered.elemsize = sVar3;
  bottom_blob_unbordered.w = iVar15;
  bottom_blob_unbordered.h = _h;
  if ((sVar3 != 1 & (&this->field_0x1c0)[(long)this->_vptr_Convolution_x86[-3]]) == 1) {
    bottom_blob_int8.elemsize._0_4_ = 0;
    bottom_blob_int8.elemsize._4_4_ = 0;
    bottom_blob_int8.packing = 0;
    bottom_blob_int8.data = (void *)0x0;
    bottom_blob_int8.refcount._0_4_ = 0;
    bottom_blob_int8.refcount._4_4_ = 0;
    bottom_blob_int8.allocator = (Allocator *)0x0;
    bottom_blob_int8.dims = 0;
    bottom_blob_int8.w = 0;
    bottom_blob_int8.h = 0;
    bottom_blob_int8.c = 0;
    bottom_blob_int8.cstep = 0;
    Mat::create(&bottom_blob_int8,iVar15,_h,bottom_blob_unbordered.c,1,opt->workspace_allocator);
    bVar8 = bottom_blob_int8.data == (void *)0x0 ||
            (long)bottom_blob_int8.c * bottom_blob_int8.cstep == 0;
    if (bVar8) {
      Mat::~Mat(&bottom_blob_int8);
      iVar9 = -100;
      goto LAB_001273b0;
    }
    opt_g.lightmode = opt->lightmode;
    opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_g.num_threads = opt->num_threads;
    opt_g.workspace_allocator._0_4_ = *(undefined4 *)&opt->workspace_allocator;
    opt_g.workspace_allocator._4_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4);
    opt_g.vulkan_compute = opt->vulkan_compute;
    opt_g._25_3_ = *(undefined3 *)&opt->field_0x19;
    opt_g.use_winograd_convolution = opt->use_winograd_convolution;
    opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_g.use_int8_inference = opt->use_int8_inference;
    opt_g.blob_allocator._0_4_ = SUB84(bottom_blob_int8.allocator,0);
    opt_g.blob_allocator._4_4_ = (undefined4)((ulong)bottom_blob_int8.allocator >> 0x20);
    (**(code **)(**(long **)(&this->field_0x1c8 + (long)this->_vptr_Convolution_x86[-3]) + 0x38))
              (*(long **)(&this->field_0x1c8 + (long)this->_vptr_Convolution_x86[-3]),bottom_blob);
    Mat::operator=(&bottom_blob_unbordered,&bottom_blob_int8);
    Mat::~Mat(&bottom_blob_int8);
    iVar9 = -100;
    if (bVar8) goto LAB_001273b0;
  }
  bottom_blob_int8.data = bottom_blob_unbordered.data;
  bottom_blob_int8.refcount._0_4_ = SUB84(bottom_blob_unbordered.refcount,0);
  bottom_blob_int8.refcount._4_4_ = (undefined4)((ulong)bottom_blob_unbordered.refcount >> 0x20);
  bottom_blob_int8.elemsize._0_4_ = (undefined4)bottom_blob_unbordered.elemsize;
  bottom_blob_int8.elemsize._4_4_ = (undefined4)(bottom_blob_unbordered.elemsize >> 0x20);
  bottom_blob_int8.packing = bottom_blob_unbordered.packing;
  bottom_blob_int8.allocator = bottom_blob_unbordered.allocator;
  bottom_blob_int8.dims = bottom_blob_unbordered.dims;
  bottom_blob_int8.w = bottom_blob_unbordered.w;
  bottom_blob_int8.h = bottom_blob_unbordered.h;
  bottom_blob_int8.c = bottom_blob_unbordered.c;
  bottom_blob_int8.cstep = bottom_blob_unbordered.cstep;
  if (bottom_blob_unbordered.refcount != (int *)0x0) {
    LOCK();
    *bottom_blob_unbordered.refcount = *bottom_blob_unbordered.refcount + 1;
    UNLOCK();
  }
  p_Var4 = this->_vptr_Convolution_x86[-3];
  iVar9 = *(int *)(&this->field_0x9c + (long)p_Var4);
  if ((iVar9 < 1) && (*(int *)(&this->field_0xa0 + (long)p_Var4) < 1)) {
    if (*(int *)(&this->field_0xa0 + (long)p_Var4) == -0xe9 && iVar9 == -0xe9) {
      iVar14 = ~((iVar15 + -1) % iVar2) + iVar11;
      iVar9 = ~((_h + -1) % iVar2) + iVar11;
      if ((iVar14 < 1) && (iVar9 < 1)) {
LAB_0012708c:
        bVar8 = true;
        iVar15 = bottom_blob_int8.w;
        _h = bottom_blob_int8.h;
      }
      else {
        copy_make_border(&bottom_blob_unbordered,&bottom_blob_int8,iVar9 / 2,iVar9 - iVar9 / 2,
                         iVar14 / 2,iVar14 - iVar14 / 2,0,0.0,opt->workspace_allocator,
                         opt->num_threads);
        if (bottom_blob_int8.data == (void *)0x0) {
          bVar8 = false;
        }
        else {
          if ((long)bottom_blob_int8.c * bottom_blob_int8.cstep != 0) goto LAB_0012708c;
          bVar8 = false;
        }
      }
      iVar9 = -100;
      if (!bVar8) goto LAB_001273a6;
    }
LAB_00126c84:
    iVar15 = (iVar15 - iVar11) / iVar2 + 1;
    iVar11 = (_h - iVar11) / iVar2 + 1;
    p_Var4 = this->_vptr_Convolution_x86[-3];
    if ((&this->field_0x1c0)[(long)p_Var4] == '\x01') {
      if ((&this->field_0x1c1)[(long)p_Var4] == '\x01') {
        opt_g.workspace_allocator._0_4_ = 0;
        opt_g.workspace_allocator._4_4_ = 0;
        opt_g.vulkan_compute = false;
        opt_g._25_3_ = 0;
        opt_g.lightmode = false;
        opt_g._1_3_ = 0;
        opt_g.num_threads = 0;
        opt_g.blob_allocator._0_4_ = 0;
        opt_g.blob_allocator._4_4_ = 0;
        opt_g.use_sgemm_convolution = 0;
        opt_g.use_int8_inference = 0;
        Mat::create((Mat *)&opt_g,iVar15,iVar11,
                    *(int *)(this->_vptr_Convolution_x86[-3] + 0x28 +
                            (long)&(this->weight_sgemm_data).data),4,opt->workspace_allocator);
        Mat::~Mat((Mat *)&opt_g);
        iVar9 = -100;
      }
      else {
        Mat::create(top_blob,iVar15,iVar11,
                    *(int *)(p_Var4 + 0x28 + (long)&(this->weight_sgemm_data).data),4,
                    opt->blob_allocator);
        iVar9 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          if (this->use_winograd3x3 == true) {
            conv3x3s1_winograd43_int8_sse
                      (&bottom_blob_int8,top_blob,&this->weight_3x3_winograd23_data,opt);
            pp_Var5 = this->_vptr_Convolution_x86;
            if (*(int *)(pp_Var5[-3] + 0x28 + (long)&(this->weight_sgemm_data).data) < 1) {
              iVar9 = 0;
            }
            else {
              lVar12 = 0;
              iVar9 = 0;
              do {
                top_blob_tm_g.elemsize = (size_t)opt->workspace_allocator;
                top_blob_tm_g.packing = *(int *)&opt->vulkan_compute;
                top_blob_tm_g._28_4_ = opt->use_winograd_convolution;
                top_blob_tm_g.allocator = *(Allocator **)&opt->use_sgemm_convolution;
                top_blob_tm_g.data = (void *)CONCAT44(1,*(undefined4 *)opt);
                opt_g._32_8_ = top_blob->allocator;
                sVar3 = top_blob->elemsize;
                opt_g._0_8_ = top_blob->cstep * lVar12 * sVar3 + (long)top_blob->data;
                opt_g._24_4_ = top_blob->packing;
                opt_g.blob_allocator._0_4_ = 0;
                opt_g.blob_allocator._4_4_ = 0;
                opt_g.workspace_allocator._0_4_ = (undefined4)sVar3;
                opt_g.workspace_allocator._4_4_ = (undefined4)(sVar3 >> 0x20);
                plVar6 = *(long **)(*(long *)(&this->field_0x1d0 + (long)pp_Var5[-3]) + lVar12 * 8);
                top_blob_tm_g.refcount = (int *)opt_g._32_8_;
                (**(code **)(*plVar6 + 0x48))(plVar6,(Mat *)&opt_g,&top_blob_tm_g);
                Mat::~Mat((Mat *)&opt_g);
                lVar12 = lVar12 + 1;
                pp_Var5 = this->_vptr_Convolution_x86;
              } while (lVar12 < *(int *)(pp_Var5[-3] + 0x28 + (long)&(this->weight_sgemm_data).data)
                      );
            }
          }
          else {
            p_Var4 = this->_vptr_Convolution_x86[-3];
            std::vector<float,_std::allocator<float>_>::vector
                      (local_c8,(vector<float,_std::allocator<float>_> *)
                                (&this->field_0x200 + (long)p_Var4));
            (*pcVar13)(&bottom_blob_int8,top_blob,&this->field_0xf8 + (long)p_Var4,
                       &this->field_0x138 + (long)p_Var4,local_c8,opt);
            iVar9 = 0;
            if (local_c8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_c8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_c8[0].super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_c8[0].super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
        }
      }
    }
    else {
      Mat::create(top_blob,iVar15,iVar11,
                  *(int *)(p_Var4 + 0x28 + (long)&(this->weight_sgemm_data).data),sVar3,
                  opt->blob_allocator);
      iVar9 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        p_Var4 = this->_vptr_Convolution_x86[-3];
        if (this->use_winograd3x3 == true) {
          conv3x3s1_winograd43_sse
                    (&bottom_blob_int8,top_blob,&this->weight_3x3_winograd23_data,
                     (Mat *)(&this->field_0x138 + (long)p_Var4),opt);
        }
        else {
          conv_im2col_sgemm_sse
                    (&bottom_blob_int8,top_blob,&this->weight_sgemm_data,
                     (Mat *)(&this->field_0x138 + (long)p_Var4),
                     *(int *)(p_Var4 + 0x2c + (long)&(this->weight_sgemm_data).data),
                     *(int *)(p_Var4 + 0x30 + (long)&(this->weight_sgemm_data).data),
                     *(int *)(p_Var4 + 0x3c + (long)&(this->weight_sgemm_data).data),
                     *(int *)(&this->field_0x98 + (long)p_Var4),opt);
        }
        pLVar7 = this->activation;
        iVar9 = 0;
        if (pLVar7 != (Layer *)0x0) {
          (*pLVar7->_vptr_Layer[9])(pLVar7,top_blob,opt);
        }
      }
    }
  }
  else {
    copy_make_border(&bottom_blob_unbordered,&bottom_blob_int8,
                     *(int *)(&this->field_0xa0 + (long)p_Var4),
                     *(int *)(&this->field_0xa0 + (long)p_Var4),iVar9,iVar9,0,0.0,
                     opt->workspace_allocator,opt->num_threads);
    iVar9 = -100;
    if ((bottom_blob_int8.data != (void *)0x0) &&
       (iVar15 = bottom_blob_int8.w, _h = bottom_blob_int8.h,
       (long)bottom_blob_int8.c * bottom_blob_int8.cstep != 0)) goto LAB_00126c84;
  }
LAB_001273a6:
  Mat::~Mat(&bottom_blob_int8);
LAB_001273b0:
  Mat::~Mat(&bottom_blob_unbordered);
  return iVar9;
}

Assistant:

int Convolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (bottom_blob.dims != 3)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    const int kernel_size = kernel_w;
    const int stride = stride_w;  

    if (kernel_size > 7 || stride > 7 || dilation_w != dilation_h)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    typedef void (*conv_func)(const Mat&, Mat&, const Mat&, const Mat&, const Option&);

    // kernel_size x stride
    conv_func conv_func_table[7][4] =
    {
        {
            conv1x1s1_sse,
            conv1x1s2_sse,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_sse,
            conv3x3s2_sse,
            0,
            0
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {
            conv5x5s1_sse,
            conv5x5s2_sse,
            0,
            0
        }, // kernel_size = 5
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 6
        {
            conv7x7s1_sse,          
            conv7x7s2_sse,          
            0,
            0
        }  // kernel_size = 7        
    };

    typedef void (*conv_int8_dequant_func)(const Mat&, Mat&, const Mat&, const Mat&, std::vector<float>, const Option&);
    typedef void (*conv_int8_requant_func)(const Mat&, Mat&, const Mat&, const Mat&, std::vector<float>, const Option&);

    // kernel_size x stride
    conv_int8_dequant_func conv_int8_dequant_func_table[7][4] =
    {
        {
            conv1x1s1_int8_dequant_sse,
            conv1x1s2_int8_dequant_sse,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_int8_dequant_sse,
            conv3x3s2_int8_dequant_sse,
            0,
            0,
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {        
            conv5x5s1_int8_dequant_sse,
            conv5x5s2_int8_dequant_sse,    
            0,
            0
        }, // kernel_size = 5
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 6
        {
            conv7x7s1_int8_dequant_sse,          
            conv7x7s2_int8_dequant_sse, 
            0,
            0
        }  // kernel_size = 7
    };

    conv_int8_requant_func conv_int8_requant_func_table[7][4] =
    {
        {
            conv1x1s1_int8_requant_sse,
            conv1x1s2_int8_requant_sse,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_int8_requant_sse,
            conv3x3s2_int8_requant_sse,
            0,
            0,
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {        
            conv5x5s1_int8_requant_sse,
            conv5x5s2_int8_requant_sse,    
            0,
            0
        }, // kernel_size = 5
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 6
        {
            conv7x7s1_int8_requant_sse,          
            conv7x7s2_int8_requant_sse, 
            0,
            0
        }  // kernel_size = 7
    };

    conv_func conv = 0;
    conv_int8_dequant_func conv_int8_dequant = 0;
    conv_int8_requant_func conv_int8_requant = 0;

    if (use_int8_inference)
    {
        if (use_int8_requantize)
            conv_int8_requant = conv_int8_requant_func_table[kernel_size-1][stride-1];
        else
            conv_int8_dequant = conv_int8_dequant_func_table[kernel_size-1][stride-1];  
        if ((!conv_int8_requant) && (!conv_int8_dequant))
        {
            return Convolution::forward(bottom_blob, top_blob, opt);
        }
    }
    else
    {
        conv = conv_func_table[kernel_size-1][stride-1];
        if (!conv)
        {
            return Convolution::forward(bottom_blob, top_blob, opt);
        }

        if (dilation_w != 1)
        {
            if (stride != 1)
                return Convolution::forward(bottom_blob, top_blob, opt);

            return forwardDilation(bottom_blob, top_blob, conv, opt);
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        // quantize, scale and round to nearest
        {
            ncnn::Option opt_g = opt;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            quantize->forward(bottom_blob, bottom_blob_int8, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_size + (w - 1) / stride * stride - w;
        int hpad = kernel_size + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_size) / stride + 1;
    int outh = (h - kernel_size) / stride + 1;

    // int8
    if (use_int8_inference)
    {         
        if (use_int8_requantize == true)
        {
            Mat top_blob_tm;
            top_blob_tm.create(outw, outh, num_output, (size_t)4u, opt.workspace_allocator);
            if (top_blob_tm.empty())
                return -100;
            
            top_blob.create(outw, outh, num_output, (size_t)1u, opt.blob_allocator);
            if (top_blob.empty())
                return -100; 

            if (use_winograd3x3)
            {
                // conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_tm, weight_3x3_winograd23_data, opt);
                conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_tm, weight_3x3_winograd23_data, opt);

                // requantize, reverse scale inplace
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p=0; p<num_output; p++)
                {
                    ncnn::Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_tm_g = top_blob_tm.channel_range(p, 1);
                    Mat top_blob_g = top_blob.channel_range(p, 1);
                    requantize_ops[p]->forward(top_blob_tm_g, top_blob_g, opt_g);
                }
            }
            else
                conv_int8_requant(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
        }
        else
        {
            top_blob.create(outw, outh, num_output, (size_t)4u, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            if (use_winograd3x3)
            {
                // conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, opt);
                conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, opt);

                // dequantize, reverse scale inplace
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p=0; p<num_output; p++)
                {
                    ncnn::Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_g = top_blob.channel_range(p, 1);
                    dequantize_ops[p]->forward_inplace(top_blob_g, opt_g);
                }
            }
            else
                conv_int8_dequant(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);     
        }

        return 0;
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;    

    if (use_winograd3x3)
    {
        //conv3x3s1_winograd23_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, bias_data, opt);
        conv3x3s1_winograd43_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, bias_data, opt);
    }
    else
        //conv(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
        conv_im2col_sgemm_sse(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, opt);

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}